

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::dynamic_string>::vector
          (vector<crnlib::dynamic_string> *this,vector<crnlib::dynamic_string> *other)

{
  uint uVar1;
  dynamic_string *other_00;
  dynamic_string *this_00;
  bool bVar2;
  
  this->m_p = (dynamic_string *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  increase_capacity(this,other->m_size,false,false);
  uVar1 = other->m_size;
  this->m_size = uVar1;
  other_00 = other->m_p;
  this_00 = this->m_p;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    dynamic_string::dynamic_string(this_00,other_00);
    other_00 = other_00 + 1;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

inline vector(const vector& other)
      : m_p(NULL),
        m_size(0),
        m_capacity(0) {
    increase_capacity(other.m_size, false);

    m_size = other.m_size;

    if (CRNLIB_IS_BITWISE_COPYABLE(T))
      memcpy(m_p, other.m_p, m_size * sizeof(T));
    else {
      T* pDst = m_p;
      const T* pSrc = other.m_p;
      for (uint i = m_size; i > 0; i--)
        helpers::construct(pDst++, *pSrc++);
    }
  }